

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void anon_unknown.dwarf_2a21b2d::FillEdge<unsigned_short>
               (ACMRandom *rnd,int num_pixels,int bd,bool trash,unsigned_short *data)

{
  uint32_t uVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  
  if ((int)CONCAT71(in_register_00000009,trash) != 0) {
    if (0 < num_pixels) {
      uVar2 = 0;
      do {
        uVar1 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
        data[uVar2] = (ushort)(uVar1 >> 0xf) & ~(ushort)(-1 << ((byte)bd & 0x1f));
        uVar2 = uVar2 + 1;
      } while ((uint)num_pixels != uVar2);
    }
    return;
  }
  memset(data,0,(long)num_pixels * 2);
  return;
}

Assistant:

void FillEdge(ACMRandom *rnd, int num_pixels, int bd, bool trash, Pixel *data) {
  if (!trash) {
    memset(data, 0, sizeof(*data) * num_pixels);
    return;
  }
  const Pixel mask = (1 << bd) - 1;
  for (int i = 0; i < num_pixels; ++i) data[i] = rnd->Rand16() & mask;
}